

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexity.cc
# Opt level: O3

LeastSq * benchmark::MinimalLeastSq
                    (LeastSq *__return_storage_ptr__,vector<int,_std::allocator<int>_> *n,
                    vector<double,_std::allocator<double>_> *time,BigOFunc *fitting_curve)

{
  pointer piVar1;
  ulong uVar2;
  pointer piVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double local_50;
  
  piVar1 = (n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar3 == piVar1) {
    uVar2 = 0;
    dVar9 = NAN;
    local_50 = 0.0;
  }
  else {
    dVar8 = 0.0;
    dVar9 = 0.0;
    local_50 = 0.0;
    uVar4 = 0;
    do {
      dVar5 = (*fitting_curve)(piVar1[uVar4]);
      dVar6 = (time->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar4];
      local_50 = local_50 + dVar6;
      dVar8 = dVar8 + dVar5 * dVar5;
      dVar9 = dVar9 + dVar6 * dVar5;
      uVar4 = uVar4 + 1;
      piVar1 = (n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      piVar3 = (n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
      uVar2 = (long)piVar3 - (long)piVar1 >> 2;
    } while (uVar4 < uVar2);
    dVar9 = dVar9 / dVar8;
  }
  __return_storage_ptr__->rms = 0.0;
  __return_storage_ptr__->complexity = oLambda;
  __return_storage_ptr__->coef = dVar9;
  dVar8 = 0.0;
  if (piVar3 != piVar1) {
    uVar4 = 0;
    do {
      dVar6 = (*fitting_curve)(piVar1[uVar4]);
      dVar6 = (time->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar4] - dVar6 * dVar9;
      dVar8 = dVar8 + dVar6 * dVar6;
      uVar4 = uVar4 + 1;
      piVar1 = (n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      uVar2 = (long)(n->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
    } while (uVar4 < uVar2);
  }
  auVar7._8_4_ = (int)(uVar2 >> 0x20);
  auVar7._0_8_ = uVar2;
  auVar7._12_4_ = 0x45300000;
  dVar9 = (auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
  dVar8 = dVar8 / dVar9;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  __return_storage_ptr__->rms = dVar8 / (local_50 / dVar9);
  return __return_storage_ptr__;
}

Assistant:

LeastSq MinimalLeastSq(const std::vector<int>& n,
                       const std::vector<double>& time,
                       BigOFunc* fitting_curve) {
  double sigma_gn = 0.0;
  double sigma_gn_squared = 0.0;
  double sigma_time = 0.0;
  double sigma_time_gn = 0.0;

  // Calculate least square fitting parameter
  for (size_t i = 0; i < n.size(); ++i) {
    double gn_i = fitting_curve(n[i]);
    sigma_gn += gn_i;
    sigma_gn_squared += gn_i * gn_i;
    sigma_time += time[i];
    sigma_time_gn += time[i] * gn_i;
  }

  LeastSq result;
  result.complexity = oLambda;

  // Calculate complexity.
  result.coef = sigma_time_gn / sigma_gn_squared;

  // Calculate RMS
  double rms = 0.0;
  for (size_t i = 0; i < n.size(); ++i) {
    double fit = result.coef * fitting_curve(n[i]);
    rms += pow((time[i] - fit), 2);
  }

  // Normalized RMS by the mean of the observed values
  double mean = sigma_time / n.size();
  result.rms = sqrt(rms / n.size()) / mean;

  return result;
}